

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMerge.c
# Opt level: O1

Cut_Cut_t * Cut_CutMergeTwo3(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1)

{
  uint uVar1;
  Cut_Cut_t *pCVar2;
  Cut_Cut_t *pCVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  
  if (*(uint *)pCut0 >> 0x1c < *(uint *)pCut1 >> 0x1c) {
    __assert_fail("pCut0->nLeaves >= pCut1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                  ,0x11c,"Cut_Cut_t *Cut_CutMergeTwo3(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  if (p->pReady == (Cut_Cut_t *)0x0) {
    pCVar3 = Cut_CutAlloc(p);
    p->pReady = pCVar3;
  }
  pCVar2 = p->pReady;
  pCVar3 = pCVar2 + 1;
  uVar8 = p->pParams->nVarsMax;
  uVar7 = *(uint *)pCut0;
  uVar4 = uVar7 >> 0x1c;
  uVar5 = *(uint *)pCut1 >> 0x1c;
  if (uVar4 == uVar8) {
    if (uVar5 == uVar8) {
      if (0xfffffff < uVar7) {
        uVar6 = 0;
        do {
          uVar8 = *(uint *)(&pCut0[1].field_0x0 + uVar6 * 4);
          *(uint *)((long)&pCVar3->field_0x0 + uVar6 * 4) = uVar8;
          if (uVar8 != *(uint *)(&pCut1[1].field_0x0 + uVar6 * 4)) {
            return (Cut_Cut_t *)0x0;
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
    }
    else {
      uVar8 = 0;
      if (0xfffffff < uVar7) {
        uVar6 = 0;
        uVar8 = 0;
        do {
          uVar9 = *(uint *)(&pCut0[1].field_0x0 + uVar6 * 4);
          *(uint *)((long)&pCVar3->field_0x0 + uVar6 * 4) = uVar9;
          if ((uVar8 != uVar5) &&
             ((int)*(uint *)(&pCut1[1].field_0x0 + (long)(int)uVar8 * 4) <= (int)uVar9)) {
            if (uVar9 != *(uint *)(&pCut1[1].field_0x0 + (long)(int)uVar8 * 4)) {
              return (Cut_Cut_t *)0x0;
            }
            uVar8 = uVar8 + 1;
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      if ((int)uVar8 < (int)uVar5) {
        return (Cut_Cut_t *)0x0;
      }
    }
    uVar6 = (ulong)(uVar7 & 0xf0000000);
  }
  else {
    if ((int)uVar8 < 1) {
      uVar9 = 0;
      uVar7 = 0;
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      uVar7 = 0;
      uVar9 = 0;
      do {
        if (uVar7 == uVar5) {
          if (uVar9 == uVar4) goto LAB_008d45d4;
          lVar11 = (long)(int)uVar9;
          uVar9 = uVar9 + 1;
          uVar10 = *(uint *)(&pCut0[1].field_0x0 + lVar11 * 4);
LAB_008d454b:
          *(uint *)pCVar3 = uVar10;
        }
        else {
          lVar11 = (long)(int)uVar7;
          if (uVar9 == uVar4) {
            uVar7 = uVar7 + 1;
            uVar10 = *(uint *)(&pCut1[1].field_0x0 + lVar11 * 4);
            goto LAB_008d454b;
          }
          uVar10 = *(uint *)(&pCut0[1].field_0x0 + (long)(int)uVar9 * 4);
          uVar1 = *(uint *)(&pCut1[1].field_0x0 + lVar11 * 4);
          if ((int)uVar10 < (int)uVar1) {
            uVar9 = uVar9 + 1;
            goto LAB_008d454b;
          }
          if ((int)uVar1 < (int)uVar10) {
            uVar7 = uVar7 + 1;
            *(uint *)pCVar3 = uVar1;
          }
          else {
            uVar9 = uVar9 + 1;
            *(uint *)pCVar3 = uVar10;
            uVar7 = uVar7 + 1;
          }
        }
        uVar6 = uVar6 + 0x10000000;
        pCVar3 = (Cut_Cut_t *)&pCVar3->uSign;
      } while ((ulong)uVar8 << 0x1c != uVar6);
    }
    if ((int)uVar9 < (int)uVar4) {
      return (Cut_Cut_t *)0x0;
    }
    if ((int)uVar7 < (int)uVar5) {
      return (Cut_Cut_t *)0x0;
    }
  }
LAB_008d45d4:
  *(uint *)pCVar2 = *(uint *)pCVar2 & 0xfffffff | (uint)uVar6;
  pCVar3 = p->pReady;
  p->pReady = (Cut_Cut_t *)0x0;
  return pCVar3;
}

Assistant:

Cut_Cut_t * Cut_CutMergeTwo3( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1 )
{ 
    Cut_Cut_t * pRes;
    int * pLeaves;
    int Limit, nLeaves0, nLeaves1;
    int i, k, c;

    assert( pCut0->nLeaves >= pCut1->nLeaves );

    // prepare the cut
    if ( p->pReady == NULL )
        p->pReady = Cut_CutAlloc( p );
    pLeaves = p->pReady->pLeaves;

    // consider two cuts
    Limit = p->pParams->nVarsMax;
    nLeaves0 = pCut0->nLeaves;
    nLeaves1 = pCut1->nLeaves;
    if ( nLeaves0 == Limit )
    { // the case when one of the cuts is the largest
        if ( nLeaves1 == Limit )
        { // the case when both cuts are the largest
            for ( i = 0; i < nLeaves0; i++ )
            {
                pLeaves[i] = pCut0->pLeaves[i];
                if ( pLeaves[i] != pCut1->pLeaves[i] )
                    return NULL;
            }
        }
        else
        {
            for ( i = k = 0; i < nLeaves0; i++ )
            {
                pLeaves[i] = pCut0->pLeaves[i];
                if ( k == (int)nLeaves1 )
                    continue;
                if ( pLeaves[i] < pCut1->pLeaves[k] )
                    continue;
                if ( pLeaves[i] == pCut1->pLeaves[k++] )
                    continue;
                return NULL;
            }
            if ( k < nLeaves1 )
                return NULL;
        }
        p->pReady->nLeaves = nLeaves0;
        pRes = p->pReady;  p->pReady = NULL;
        return pRes;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < Limit; c++ )
    {
        if ( k == nLeaves1 )
        {
            if ( i == nLeaves0 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( i == nLeaves0 )
        {
            if ( k == nLeaves1 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        if ( pCut0->pLeaves[i] < pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( pCut0->pLeaves[i] > pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        pLeaves[c] = pCut0->pLeaves[i++]; 
        k++;
    }
    if ( i < nLeaves0 || k < nLeaves1 )
        return NULL;
    p->pReady->nLeaves = c;
    pRes = p->pReady;  p->pReady = NULL;
    return pRes;
}